

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators)

{
  int iVar1;
  cmExternalMakefileProjectGeneratorFactory *pcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  ulong uVar5;
  pointer pbVar6;
  GeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined2 local_a0;
  bool local_9e;
  pointer local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_78;
  cmake *local_58;
  string local_50;
  
  local_98 = (pointer)(this->Generators).
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  for (ppcVar3 = (this->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; (pointer)ppcVar3 != local_98;
      ppcVar3 = ppcVar3 + 1) {
    local_78.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[4])(*ppcVar3,&local_78);
    for (uVar5 = 0;
        uVar5 < (ulong)((long)(local_78._M_string_length - (long)local_78._M_dataplus._M_p) >> 5);
        uVar5 = uVar5 + 1) {
      local_100._0_8_ = local_100 + 0x10;
      local_100._8_8_ = 0;
      local_100[0x10] = '\0';
      local_e0._M_p = (pointer)&local_d0;
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      local_c0._M_p = (pointer)&local_b0;
      local_b8 = 0;
      local_b0._M_local_buf[0] = '\0';
      iVar1 = (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[5])();
      local_a0._0_1_ = SUB41(iVar1,0);
      iVar1 = (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[6])();
      local_a0._1_1_ = SUB41(iVar1,0);
      std::__cxx11::string::_M_assign((string *)local_100);
      std::__cxx11::string::_M_assign((string *)&local_e0);
      local_9e = false;
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(GeneratorInfo *)local_100);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_100);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
  }
  local_98 = (local_58->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar4 = (local_58->ExtraGenerators).
                 super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar4 != local_98;
      ppcVar4 = ppcVar4 + 1) {
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              (&local_90,*ppcVar4);
    for (pbVar6 = local_90.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != local_90.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      local_100._0_8_ = local_100 + 0x10;
      local_100._8_8_ = 0;
      local_100[0x10] = '\0';
      local_e0._M_p = (pointer)&local_d0;
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      local_c0._M_p = (pointer)&local_b0;
      local_b8 = 0;
      local_b0._M_local_buf[0] = '\0';
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,*ppcVar4);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_78,pbVar6,&local_50);
      std::__cxx11::string::operator=((string *)local_100,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::_M_assign((string *)&local_e0);
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_78,*ppcVar4);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      local_a0._0_1_ = false;
      local_a0._1_1_ = false;
      local_9e = false;
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(GeneratorInfo *)local_100);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_100);
    }
    pcVar2 = *ppcVar4;
    for (pbVar6 = (pcVar2->Aliases).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != (pcVar2->Aliases).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      local_100._0_8_ = local_100 + 0x10;
      local_100._8_8_ = 0;
      local_100[0x10] = '\0';
      local_e0._M_p = (pointer)&local_d0;
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      local_c0._M_p = (pointer)&local_b0;
      local_b8 = 0;
      local_b0._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)local_100);
      if (local_90.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_90.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::at(&local_90,0);
        std::__cxx11::string::_M_assign((string *)&local_e0);
      }
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_78,*ppcVar4);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      local_a0._0_1_ = false;
      local_a0._1_1_ = false;
      local_9e = true;
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,(GeneratorInfo *)local_100);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_100);
      pcVar2 = *ppcVar4;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(
  std::vector<GeneratorInfo>& generators) const
{
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin(),
                                                  e = this->Generators.end();
       i != e; ++i) {
    std::vector<std::string> names;
    (*i)->GetGenerators(names);

    for (size_t j = 0; j < names.size(); ++j) {
      GeneratorInfo info;
      info.supportsToolset = (*i)->SupportsToolset();
      info.supportsPlatform = (*i)->SupportsPlatform();
      info.name = names[j];
      info.baseName = names[j];
      info.isAlias = false;
      generators.push_back(info);
    }
  }

  for (RegisteredExtraGeneratorsVector::const_iterator
         i = this->ExtraGenerators.begin(),
         e = this->ExtraGenerators.end();
       i != e; ++i) {
    const std::vector<std::string> genList =
      (*i)->GetSupportedGlobalGenerators();
    for (std::vector<std::string>::const_iterator gen = genList.begin();
         gen != genList.end(); ++gen) {
      GeneratorInfo info;
      info.name = cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
        *gen, (*i)->GetName());
      info.baseName = *gen;
      info.extraName = (*i)->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = false;
      generators.push_back(info);
    }
    for (std::vector<std::string>::const_iterator a = (*i)->Aliases.begin();
         a != (*i)->Aliases.end(); ++a) {
      GeneratorInfo info;
      info.name = *a;
      if (!genList.empty()) {
        info.baseName = genList.at(0);
      }
      info.extraName = (*i)->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = true;
      generators.push_back(info);
    }
  }
}